

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_ObjIsDelayCriticalFanin(Acb_Ntk_t *p,int i,int f)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar1 = Acb_ObjIsCi(p,f);
  uVar2 = 0;
  if (iVar1 == 0) {
    if (i < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                    ,0x114,"int Acb_ObjLevelR(Acb_Ntk_t *, int)");
    }
    iVar1 = Vec_IntEntry(&p->vLevelR,i);
    iVar3 = Acb_ObjLevelD(p,f);
    uVar2 = (uint)(iVar3 + iVar1 == p->LevelMax);
  }
  return uVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

static inline int Acb_ObjIsDelayCriticalFanin( Acb_Ntk_t * p, int i, int f )  { return !Acb_ObjIsCi(p, f) && Acb_ObjLevelR(p, i) + Acb_ObjLevelD(p, f) == p->LevelMax; }